

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandSetExclusive
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  string local_b8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_98;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  string local_50;
  
  if (raii) {
    local_b8.field_2._M_allocated_capacity = 0;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    generateRAIIHandleCommandEnhanced
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
               (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)&local_98,definition,(CommandFlavourFlags)0x0);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&local_98);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
  }
  else {
    generateCommandStandard(&local_b8,this,name,commandData,initialSkipCount,definition);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    generateCommandEnhanced
              (&local_50,this,name,commandData,initialSkipCount,definition,
               (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)&local_98,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (CommandFlavourFlags)0x0);
    generateCommandSet(__return_storage_ptr__,this,&local_b8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandSetExclusive(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  if ( raii )
  {
    return generateRAIIHandleCommandEnhanced( name, commandData, initialSkipCount, {}, {}, definition );
  }
  else
  {
    return generateCommandSet( generateCommandStandard( name, commandData, initialSkipCount, definition ),
                               generateCommandEnhanced( name, commandData, initialSkipCount, definition, {}, {}, {} ) );
  }
}